

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O0

QDataStream * QtPrivate::readArrayBasedContainer<QList<Qt::Key>>(QDataStream *s,QList<Qt::Key> *c)

{
  long lVar1;
  Status SVar2;
  qint64 qVar3;
  QList<Qt::Key> *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000008;
  qsizetype i;
  qsizetype n;
  qint64 size;
  value_type t;
  StreamStateSaver stateSaver;
  undefined4 in_stack_ffffffffffffff98;
  parameter_type in_stack_ffffffffffffff9c;
  StreamStateSaver *in_stack_ffffffffffffffa0;
  long local_58;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  StreamStateSaver::StreamStateSaver
            (in_stack_ffffffffffffffa0,
             (QDataStream *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  QList<Qt::Key>::clear((QList<Qt::Key> *)in_stack_ffffffffffffffa0);
  qVar3 = QDataStream::readQSizeType((QDataStream *)in_stack_ffffffffffffffa0);
  if (qVar3 < 0) {
    QDataStream::setStatus((Status)in_RDI);
  }
  else {
    QList<Qt::Key>::reserve(in_RSI,in_stack_00000008);
    for (local_58 = 0; local_58 < qVar3; local_58 = local_58 + 1) {
      ::operator>>((QDataStream *)in_stack_ffffffffffffffa0,
                   (Key *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      SVar2 = QDataStream::status(in_RDI);
      if (SVar2 != Ok) {
        QList<Qt::Key>::clear((QList<Qt::Key> *)in_stack_ffffffffffffffa0);
        break;
      }
      QList<Qt::Key>::append((QList<Qt::Key> *)0x3fade8,in_stack_ffffffffffffff9c);
    }
  }
  StreamStateSaver::~StreamStateSaver(in_stack_ffffffffffffffa0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}